

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_lstore(ExecutionEngine *this)

{
  uint32_t index;
  u2 uVar1;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar2;
  anon_union_8_10_52016fac_for_data extraout_RDX;
  ushort uVar3;
  Value VVar4;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar4 = Frame::popTopOfOperandStack(this_01);
  if (VVar4.type != LONG) {
    __assert_fail("value.type == ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x49f,"void ExecutionEngine::i_lstore()");
  }
  Frame::popTopOfOperandStack(this_01);
  puVar2 = Frame::getCode(this_01,this_01->pc);
  uVar3 = (ushort)puVar2[1];
  if (this->_isWide == true) {
    uVar3 = CONCAT11(puVar2[1],puVar2[2]);
    this_01->pc = this_01->pc + 3;
    this->_isWide = false;
  }
  else {
    this_01->pc = this_01->pc + 2;
  }
  uVar1 = Frame::sizeLocalVariables(this_01);
  index = (int)(short)uVar3 + 1;
  if ((int)index < (int)(short)uVar1) {
    Frame::changeLocalVariable(this_01,VVar4,(int)(short)uVar3);
    VVar4.data.longValue = extraout_RDX.longValue;
    VVar4.printType = BOOLEAN;
    VVar4.type = PADDING;
    Frame::changeLocalVariable(this_01,VVar4,index);
    return;
  }
  __assert_fail("((int16_t)(topFrame->sizeLocalVariables()) > (index + 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x4af,"void ExecutionEngine::i_lstore()");
}

Assistant:

void ExecutionEngine::i_lstore() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value = topFrame->popTopOfOperandStack();
	assert(value.type == ValueType::LONG);
	topFrame->popTopOfOperandStack(); //padding

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1]; //índice do vetor de variáveis locais
	int16_t index = (int16_t)byte1;

	if (_isWide) {
		u1 byte2 = code[2];
		index = (byte1 << 8) | byte2;
		topFrame->pc += 3;
		_isWide = false;
	} else {
		topFrame->pc += 2;
	}

	assert(((int16_t)(topFrame->sizeLocalVariables()) > (index + 1)));
	topFrame->changeLocalVariable(value, index);
	Value padding;
	padding.type = ValueType::PADDING;
	topFrame->changeLocalVariable(padding, index + 1);
}